

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O2

string * __thiscall
cfd::core::Privkey::ConvertWif_abi_cxx11_
          (string *__return_storage_ptr__,Privkey *this,NetType net_type,bool is_compressed)

{
  int iVar1;
  size_t sVar2;
  CfdException *this_00;
  undefined8 uVar3;
  char *wally_string;
  int ret;
  char *wif_ptr;
  string local_60;
  CfdSourceLocation local_40;
  
  wif_ptr = (char *)0x0;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,&this->data_
                    );
  sVar2 = ByteData::GetDataSize(&this->data_);
  uVar3 = 0xef;
  if (net_type == kMainnet) {
    uVar3 = 0x80;
  }
  iVar1 = wally_wif_from_bytes(local_60._M_dataplus._M_p,sVar2,uVar3,!is_compressed,&wif_ptr);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60);
  ret = iVar1;
  if (iVar1 == 0) {
    WallyUtil::ConvertStringAndFree_abi_cxx11_
              (__return_storage_ptr__,(WallyUtil *)wif_ptr,wally_string);
    return __return_storage_ptr__;
  }
  local_40.filename = "cfdcore_key.cpp";
  local_40.line = 0x110;
  local_40.funcname = "ConvertWif";
  ByteData::GetHex_abi_cxx11_(&local_60,&this->data_);
  logger::warn<int&,std::__cxx11::string>
            (&local_40,"wally_wif_from_bytes error. ret={} bytes={}.",&ret,&local_60);
  ::std::__cxx11::string::~string((string *)&local_60);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&local_60,"Error Private key to WIF.",(allocator *)&local_40);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_60);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::string Privkey::ConvertWif(NetType net_type, bool is_compressed) const {
  uint32_t prefix = (net_type == kMainnet ? kPrefixMainnet : kPrefixTestnet);
  uint32_t flags =
      (is_compressed ? WALLY_WIF_FLAG_COMPRESSED
                     : WALLY_WIF_FLAG_UNCOMPRESSED);
  char *wif_ptr = NULL;

  int ret = wally_wif_from_bytes(
      data_.GetBytes().data(), data_.GetDataSize(), prefix, flags, &wif_ptr);
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "wally_wif_from_bytes error. ret={} bytes={}.", ret,
        data_.GetHex());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Error Private key to WIF.");
  }
  std::string wif = WallyUtil::ConvertStringAndFree(wif_ptr);
  return wif;
}